

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

int Lodtalk::ScriptContext::stExecuteFileNamed(InterpreterProxy *interpreter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Oop object;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Oop object_00;
  NativeError *this;
  string basePathString;
  string fileNameString;
  string fullFileName;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_02;
  
  iVar2 = (**interpreter->_vptr_InterpreterProxy)();
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0x1a])(interpreter);
  if (CONCAT44(extraout_var_00,iVar3) != 1) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar2;
  }
  iVar3 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  object_00.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  object_00.field_0.uintValue._4_4_ = extraout_var_02;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (object_00.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    object.field_0 =
         (anon_union_8_4_0eb573b0_for_Oop_0)
         ((anon_union_8_4_0eb573b0_for_Oop_0 *)(CONCAT44(extraout_var_01,iVar3) + 0x20))->pointer;
    if (object.field_0 != (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
      VMContext::getByteStringData_abi_cxx11_
                (&local_70,(VMContext *)CONCAT44(extraout_var,iVar2),object);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    VMContext::getByteStringData_abi_cxx11_
              (&local_70,(VMContext *)CONCAT44(extraout_var,iVar2),object_00);
    joinPath(&local_50,&local_90,&local_70);
    (*interpreter->_vptr_InterpreterProxy[1])(interpreter,&NilObject);
    iVar2 = executeScriptFromFileNamed(interpreter,&local_50);
    if (iVar2 == 0) {
      iVar2 = (*interpreter->_vptr_InterpreterProxy[0x11])(interpreter);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    return iVar2;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"expected a file name.","");
  this = (NativeError *)__cxa_allocate_exception(0x28);
  NativeError::NativeError(this,&local_90);
  __cxa_throw(this,&NativeError::typeinfo,NativeError::~NativeError);
}

Assistant:

int ScriptContext::stExecuteFileNamed(InterpreterProxy *interpreter)
{
    auto context = interpreter->getContext();
    if(interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();
    auto self = reinterpret_cast<ScriptContext*> (interpreter->getReceiver().pointer);

    auto fileNameOop = interpreter->getTemporary(0);
	if(fileNameOop.isNil())
		nativeError("expected a file name.");

    std::string basePathString;
	if(!self->basePath.isNil())
		basePathString = context->getByteStringData(self->basePath);
	std::string fileNameString = context->getByteStringData(fileNameOop);
	std::string fullFileName = joinPath(basePathString, fileNameString);

    interpreter->pushOop(Oop());
	auto res = executeScriptFromFileNamed(interpreter, fullFileName);
    if(res != 0)
        return res;
    return interpreter->returnTop();
}